

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp.h
# Opt level: O2

void csp_bind_lambda(CSP *csp,char *name,function<void_(int)> *fn)

{
  mapped_type *this;
  unique_lock<std::mutex> lock;
  allocator<char> local_49;
  unique_lock<std::mutex> local_48;
  key_type local_38;
  
  if ((name != (char *)0x0 && csp != (CSP *)0x0) &&
     ((fn->super__Function_base)._M_manager != (_Manager_type)0x0)) {
    std::unique_lock<std::mutex>::unique_lock(&local_48,&csp->process_data_mutex);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,name,&local_49);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int)>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int)>_>_>_>
           ::operator[](&csp->lambdas,&local_38);
    std::function<void_(int)>::operator=(this,fn);
    std::__cxx11::string::~string((string *)&local_38);
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
  }
  return;
}

Assistant:

void csp_bind_lambda(CSP* csp, char const*const name, std::function<void(int)> fn)
{
    if (!csp || !name || !fn)
        return;

    // guard against adding processes, or changing them
    std::unique_lock<std::mutex> lock(csp->process_data_mutex);
    csp->lambdas[name] = fn;
}